

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
process_final_deregs_if_any
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  final_dereg_coop_container_t coops;
  anon_class_8_1_a7c129e6 local_80;
  _Deque_impl_data local_78;
  
  while ((this->m_final_dereg_coops).
         super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->m_final_dereg_coops).
         super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::_Deque_base
              ((_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&local_78);
    std::swap<std::_Deque_base<so_5::coop_t*,std::allocator<so_5::coop_t*>>::_Deque_impl_data>
              (&local_78,(_Deque_impl_data *)&this->m_final_dereg_coops);
    local_80.coops = (final_dereg_coop_container_t *)&local_78;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::process_final_deregs_if_any(std::unique_lock<std::mutex>&)::_lambda()_1_>
              (acquired_lock,&local_80);
    std::_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::~_Deque_base
              ((_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&local_78);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::process_final_deregs_if_any(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		// This loop is necessary because it is possible that new
		// final dereg demand will be added during processing of
		// the current final dereg demand.
		while( !m_final_dereg_coops.empty() )
			{
				final_dereg_coop_container_t coops;
				coops.swap( m_final_dereg_coops );

				helpers::unlock_do_and_lock_again( acquired_lock,
					[&coops] {
						for( auto ptr : coops )
							coop_t::call_final_deregister_coop( ptr );
					} );
			}
	}